

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O2

ConstPoolNode * __thiscall
asmjit::v1_14::ZoneAllocator::newT<asmjit::v1_14::ConstPoolNode,asmjit::v1_14::BaseBuilder*>
          (ZoneAllocator *this,BaseBuilder **args)

{
  BaseBuilder *pBVar1;
  ConstPoolNode *pCVar2;
  
  pCVar2 = (ConstPoolNode *)alloc(this,0x140);
  if (pCVar2 != (ConstPoolNode *)0x0) {
    pBVar1 = *args;
    *(undefined8 *)pCVar2 = 0;
    *(undefined8 *)(pCVar2 + 8) = 0;
    pCVar2[0x10] = (ConstPoolNode)0x3;
    pCVar2[0x11] = (ConstPoolNode)(pBVar1->_nodeFlags | (kActsAsLabel|kHasNoEffect));
    *(undefined8 *)(pCVar2 + 0x12) = 0;
    *(undefined8 *)(pCVar2 + 0x1a) = 0;
    *(undefined8 *)(pCVar2 + 0x22) = 0;
    *(undefined8 *)(pCVar2 + 0x2a) = 0;
    *(undefined2 *)(pCVar2 + 0x32) = 0;
    ConstPool::ConstPool((ConstPool *)(pCVar2 + 0x38),&pBVar1->_codeZone);
    pCVar2[0x10] = (ConstPoolNode)0x8;
    pCVar2[0x11] = (ConstPoolNode)((byte)pCVar2[0x11] & 0xec | 2);
  }
  return pCVar2;
}

Assistant:

inline T* newT(Args&&... args) noexcept {
    void* p = allocT<T>();
    if (ASMJIT_UNLIKELY(!p))
      return nullptr;
    return new(Support::PlacementNew{p}) T(std::forward<Args>(args)...);
  }